

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall IRBuilder::BuildBrEnvProperty(IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  short sVar1;
  code *pcVar2;
  bool bVar3;
  OpCode opcode;
  RegSlot reg;
  PropertyId propertyId_00;
  uint uVar4;
  OpLayoutBrEnvProperty *pOVar5;
  SymOpnd *pSVar6;
  RegOpnd *dstOpnd;
  Instr *instr_00;
  JITTimeFunctionBody *this_00;
  PropertySym *sym;
  undefined4 *puVar7;
  BranchInstr *branchInstr_00;
  uint targetOffset;
  PropertyId propertyId;
  PropertySym *fieldSym;
  SymOpnd *fieldOpnd;
  RegOpnd *regOpnd;
  BranchInstr *branchInstr;
  Instr *instr;
  OpLayoutBrEnvProperty *branchInsn;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  bVar3 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1d25,"(!OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "!OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pOVar5 = Js::ByteCodeReader::BrEnvProperty(&this->m_jnReader);
  reg = GetEnvReg(this);
  pSVar6 = BuildFieldOpnd(this,LdSlotArr,reg,pOVar5->SlotIndex,0xffffffff,PropertyKindSlotArray,
                          0xffffffff);
  dstOpnd = IR::RegOpnd::New(TyVar,this->m_func);
  instr_00 = IR::Instr::New(LdSlotArr,&dstOpnd->super_Opnd,&pSVar6->super_Opnd,this->m_func);
  AddInstr(this,instr_00,offset);
  this_00 = Func::GetJITFunctionBody(this->m_func);
  propertyId_00 = JITTimeFunctionBody::GetReferencedPropertyId(this_00,pOVar5->PropertyIdIndex);
  uVar4 = Js::ByteCodeReader::GetCurrentOffset(&this->m_jnReader);
  sVar1 = pOVar5->RelativeJumpOffset;
  sym = PropertySym::New(dstOpnd->m_sym,propertyId_00,pOVar5->PropertyIdIndex,0xffffffff,
                         PropertyKindData,this->m_func);
  pSVar6 = IR::SymOpnd::New(&sym->super_Sym,TyVar,this->m_func);
  if ((newOpcode != BrOnHasEnvProperty) && (newOpcode != BrOnHasLocalEnvProperty)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1d39,
                       "(newOpcode == Js::OpCode::BrOnHasEnvProperty || newOpcode == Js::OpCode::BrOnHasLocalEnvProperty)"
                       ,
                       "newOpcode == Js::OpCode::BrOnHasEnvProperty || newOpcode == Js::OpCode::BrOnHasLocalEnvProperty"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  opcode = BrOnHasLocalProperty;
  if (newOpcode == BrOnHasEnvProperty) {
    opcode = BrOnHasProperty;
  }
  branchInstr_00 = IR::BranchInstr::New(opcode,(LabelInstr *)0x0,&pSVar6->super_Opnd,this->m_func);
  AddBranchInstr(this,branchInstr_00,offset,uVar4 + (int)sVar1);
  return;
}

Assistant:

void
IRBuilder::BuildBrEnvProperty(Js::OpCode newOpcode, uint32 offset)
{
    Assert(!OpCodeAttr::HasMultiSizeLayout(newOpcode));

    const unaligned   Js::OpLayoutBrEnvProperty *branchInsn = m_jnReader.BrEnvProperty();
    IR::Instr *instr;
    IR::BranchInstr * branchInstr;
    IR::RegOpnd *regOpnd;
    IR::SymOpnd *fieldOpnd;
    PropertySym *fieldSym;

    fieldOpnd = this->BuildFieldOpnd(Js::OpCode::LdSlotArr, this->GetEnvReg(), branchInsn->SlotIndex, (Js::PropertyIdIndexType)-1, PropertyKindSlotArray);
    regOpnd = IR::RegOpnd::New(TyVar, m_func);
    instr = IR::Instr::New(Js::OpCode::LdSlotArr, regOpnd, fieldOpnd, m_func);
    this->AddInstr(instr, offset);

    Js::PropertyId    propertyId =
        m_func->GetJITFunctionBody()->GetReferencedPropertyId(branchInsn->PropertyIdIndex);
    unsigned int      targetOffset = m_jnReader.GetCurrentOffset() + branchInsn->RelativeJumpOffset;\
    fieldSym = PropertySym::New(regOpnd->m_sym, propertyId, branchInsn->PropertyIdIndex, (uint)-1, PropertyKindData, m_func);
    fieldOpnd = IR::SymOpnd::New(fieldSym, TyVar, m_func);

    Assert(newOpcode == Js::OpCode::BrOnHasEnvProperty || newOpcode == Js::OpCode::BrOnHasLocalEnvProperty);
    branchInstr = IR::BranchInstr::New(newOpcode == Js::OpCode::BrOnHasEnvProperty ? Js::OpCode::BrOnHasProperty : Js::OpCode::BrOnHasLocalProperty, nullptr, fieldOpnd, m_func);
    this->AddBranchInstr(branchInstr, offset, targetOffset);
}